

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O0

ErrorType __thiscall
Network::Client::ImplBase<Network::Client::MQTTv5::Impl>::prepareSAR
          (ImplBase<Network::Client::MQTTv5::Impl> *this,ControlPacketSerializable *packet,
          bool withAnswer,bool isPublish)

{
  _func_int *p_Var1;
  PacketStorage *pPVar2;
  StackHeapBuffer *this_00;
  ControlPacketSerializable *pCVar3;
  undefined1 *ptr;
  ImplBase<Network::Client::MQTTv5::Impl> *this_01;
  ushort uVar4;
  uint32 packetSize_00;
  uint uVar5;
  uchar *puVar6;
  void *buffer_00;
  bool withAnswer_00;
  ulong uVar7;
  undefined1 *puVar8;
  ulong uVar9;
  Buffers *pBVar10;
  undefined1 auStack_198 [12];
  int32 local_18c;
  void *local_188;
  undefined1 local_17b;
  undefined1 local_17a;
  undefined1 local_179;
  PacketStorage *local_178;
  ushort local_16a;
  uchar *local_168;
  uint8 local_15d;
  uint local_15c;
  StackHeapBuffer *local_158;
  ControlPacketSerializable *local_150;
  uchar *local_148;
  ulong local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  ImplBase<Network::Client::MQTTv5::Impl> *local_128;
  ushort local_11c;
  uint8 local_119;
  undefined1 local_118 [4];
  uint16 packetID;
  uint8 QoS;
  PublishPacket publish;
  undefined1 local_38 [8];
  StackHeapBuffer buffer;
  uint32 packetSize;
  bool isPublish_local;
  bool withAnswer_local;
  ControlPacketSerializable *packet_local;
  ImplBase<Network::Client::MQTTv5::Impl> *this_local;
  
  puVar8 = auStack_198;
  local_128 = this;
  buffer.size._6_1_ = isPublish;
  buffer.size._7_1_ = withAnswer;
  buffer.size._0_4_ = (*(packet->super_Serializable)._vptr_Serializable[3])(packet,1);
  if ((uint)buffer.size < 0x201) {
    puVar8 = auStack_198 + -((ulong)(uint)buffer.size + 0xf & 0xfffffffffffffff0);
    local_130 = puVar8;
  }
  else {
    local_130 = (undefined1 *)malloc((ulong)(uint)buffer.size);
  }
  ptr = local_130;
  local_138 = local_130;
  if ((uint)buffer.size < 0x201) {
    local_140 = -(ulong)(uint)buffer.size;
  }
  else {
    local_140 = (ulong)(uint)buffer.size;
  }
  uVar7 = local_140;
  local_158 = (StackHeapBuffer *)local_38;
  *(undefined8 *)(puVar8 + -8) = 0x13200a;
  Platform::StackHeapBuffer::StackHeapBuffer((StackHeapBuffer *)local_38,ptr,uVar7);
  this_00 = local_158;
  local_150 = packet;
  *(undefined8 *)(puVar8 + -8) = 0x132021;
  puVar6 = Platform::StackHeapBuffer::operator_cast_to_unsigned_char_(this_00);
  pCVar3 = local_150;
  p_Var1 = (local_150->super_Serializable)._vptr_Serializable[1];
  local_148 = puVar6;
  *(undefined8 *)(puVar8 + -8) = 0x132041;
  local_15c = (*p_Var1)(pCVar3,puVar6);
  if (local_15c != (uint)buffer.size) {
    *(undefined8 *)(puVar8 + -8) = 0x132062;
    MQTTv5::ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),UnknownError);
    publish.payload.size = 1;
    goto LAB_0013226b;
  }
  if ((buffer.size._6_1_ & 1) != 0) {
    *(undefined8 *)(puVar8 + -8) = 0x13209b;
    Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)3,_false>::
    ControlPacket((ControlPacket<(Protocol::MQTT::Common::ControlPacketType)3,_false> *)local_118,
                  (ControlPacket<(Protocol::MQTT::Common::ControlPacketType)3,_false> *)packet);
    *(undefined8 *)(puVar8 + -8) = 0x1320a9;
    local_15d = Protocol::MQTT::V5::
                FixedHeaderType<(Protocol::MQTT::Common::ControlPacketType)3,_(unsigned_char)'\x00'>
                ::getQoS((FixedHeaderType<(Protocol::MQTT::Common::ControlPacketType)3,_(unsigned_char)__x00_>
                          *)&publish.super_ControlPacketSerializableImpl.payload);
    local_119 = local_15d;
    if (local_15d == '\0') goto LAB_00132206;
    local_11c = (ushort)publish.fixedVariableHeader.super_TopicAndID.topicName.data;
    local_178 = local_128->storage;
    local_16a = (ushort)publish.fixedVariableHeader.super_TopicAndID.topicName.data;
    *(undefined8 *)(puVar8 + -8) = 0x132104;
    puVar6 = Platform::StackHeapBuffer::operator_cast_to_unsigned_char_((StackHeapBuffer *)local_38)
    ;
    pPVar2 = local_178;
    uVar7 = (ulong)(uint)buffer.size;
    p_Var1 = *local_178->_vptr_PacketStorage;
    uVar9 = (ulong)local_16a;
    local_168 = puVar6;
    *(undefined8 *)(puVar8 + -8) = 0x132130;
    uVar5 = (*p_Var1)(pPVar2,uVar9,puVar6,uVar7);
    uVar4 = local_11c;
    local_179 = (undefined1)uVar5;
    if ((uVar5 & 1) == 0) {
      *(undefined8 *)(puVar8 + -8) = 0x132152;
      MQTTv5::ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),StorageError);
      publish.payload.size = 1;
    }
    else if (local_119 == '\x01') {
      pBVar10 = &local_128->buffers;
      *(undefined8 *)(puVar8 + -8) = 0x1321a0;
      local_17a = Buffers::storeQoS1ID(pBVar10,(uint)uVar4);
      if ((bool)local_17a) goto LAB_001321b4;
LAB_001321eb:
      *(undefined8 *)(puVar8 + -8) = 0x1321f9;
      MQTTv5::ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),StorageError);
      publish.payload.size = 1;
    }
    else {
LAB_001321b4:
      uVar4 = local_11c;
      if (local_119 == '\x02') {
        pBVar10 = &local_128->buffers;
        *(undefined8 *)(puVar8 + -8) = 0x1321d7;
        local_17b = Buffers::storeQoS2ID(pBVar10,(uint)uVar4);
        if (!(bool)local_17b) goto LAB_001321eb;
      }
LAB_00132206:
      publish.payload.size = 0;
    }
    *(undefined8 *)(puVar8 + -8) = 0x132219;
    Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)3,_false>::
    ~ControlPacket((ControlPacket<(Protocol::MQTT::Common::ControlPacketType)3,_false> *)local_118);
    if (publish.payload.size != 0) goto LAB_0013226b;
  }
  *(undefined8 *)(puVar8 + -8) = 0x13222d;
  buffer_00 = Platform::StackHeapBuffer::operator_cast_to_void_((StackHeapBuffer *)local_38);
  packetSize_00 = (uint)buffer.size;
  this_01 = local_128;
  withAnswer_00 = (bool)(buffer.size._7_1_ & 1);
  local_188 = buffer_00;
  *(undefined8 *)(puVar8 + -8) = 0x132253;
  local_18c = (int32)sendAndReceive(this_01,buffer_00,packetSize_00,withAnswer_00);
  publish.payload.size = 1;
  this_local._4_4_ = (ErrorType)local_18c;
LAB_0013226b:
  *(undefined8 *)(puVar8 + -8) = 0x132274;
  Platform::StackHeapBuffer::~StackHeapBuffer((StackHeapBuffer *)local_38);
  return (ErrorType)this_local._4_4_;
}

Assistant:

ErrorType prepareSAR(Protocol::MQTT::V5::ControlPacketSerializable & packet, bool withAnswer = true, bool isPublish = false)
        {
            // Ok, setting are done, let's build this packet now
            uint32 packetSize = packet.computePacketSize();
            DeclareStackHeapBuffer(buffer, packetSize, StackSizeAllocationLimit);
            if (packet.copyInto(buffer) != packetSize)
                return ErrorType::UnknownError;

#if MQTTQoSSupportLevel == -1
#else
            // Check for saving publish packet if required
            if (isPublish)
            {
                Protocol::MQTT::V5::PublishPacket publish = (Protocol::MQTT::V5::PublishPacket&)packet;
                uint8 QoS = publish.header.getQoS();
                if (QoS > 0) {
                    uint16 packetID = publish.fixedVariableHeader.packetID;
  #if MQTTQoSSupportLevel == 1
                    // Save packet
                    if (!storage->savePacketBuffer(packetID, buffer, packetSize))
                        return ErrorType::StorageError;
  #endif
                    // Save packet ID too
                    if ((QoS == 1 && !buffers.storeQoS1ID(packetID)) || (QoS == 2 && !buffers.storeQoS2ID(packetID)))
                        return ErrorType::StorageError;
                }
            }
#endif

    #if MQTTDumpCommunication == 1
    //      String out;
    //      packet.dump(out, 2);
    //      printf("Prepared:\n%s\n", (const char*)out);
    #endif
            return sendAndReceive(buffer, packetSize, withAnswer);
        }